

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O1

void __thiscall MinVR::VRDisplayNode::clearChildren(VRDisplayNode *this,bool destroyChildren)

{
  undefined3 in_register_00000031;
  pointer ppVVar1;
  
  if (CONCAT31(in_register_00000031,destroyChildren) != 0) {
    for (ppVVar1 = (this->_children).
                   super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVVar1 !=
        (this->_children).
        super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppVVar1 = ppVVar1 + 1) {
      if (*ppVVar1 != (VRDisplayNode *)0x0) {
        (*(*ppVVar1)->_vptr_VRDisplayNode[1])();
      }
    }
  }
  ppVVar1 = (this->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_children).
      super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar1) {
    (this->_children).
    super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar1;
  }
  return;
}

Assistant:

void VRDisplayNode::clearChildren(bool destroyChildren) {
	if (destroyChildren) {
		for (std::vector<VRDisplayNode*>::iterator it = _children.begin(); it != _children.end(); it++) {
				delete (*it);
		}
	}

	_children.clear();
}